

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotated_y(vec4 *m,float angle,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar10 = cosf(angle);
  fVar11 = sinf(angle);
  fVar12 = -fVar11;
  fVar1 = (*m)[0];
  fVar2 = (*m)[1];
  fVar3 = (*m)[2];
  fVar4 = m[1][0];
  fVar5 = m[1][1];
  fVar6 = m[1][2];
  fVar7 = m[2][0];
  fVar8 = m[2][1];
  fVar9 = m[2][2];
  (*dest)[0] = fVar3 * fVar11 + fVar2 * 0.0 + fVar1 * fVar10;
  (*dest)[1] = fVar3 * 0.0 + fVar2 * 1.0 + fVar1 * 0.0;
  (*dest)[2] = fVar3 * fVar10 + fVar2 * 0.0 + fVar1 * fVar12;
  (*dest)[3] = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0;
  dest[1][0] = fVar6 * fVar11 + fVar5 * 0.0 + fVar4 * fVar10;
  dest[1][1] = fVar6 * 0.0 + fVar5 * 1.0 + fVar4 * 0.0;
  dest[1][2] = fVar6 * fVar10 + fVar5 * 0.0 + fVar4 * fVar12;
  dest[1][3] = fVar6 * 0.0 + fVar5 * 0.0 + fVar4 * 0.0;
  dest[2][0] = fVar9 * fVar11 + fVar8 * 0.0 + fVar7 * fVar10;
  dest[2][1] = fVar9 * 0.0 + fVar8 * 1.0 + fVar7 * 0.0;
  dest[2][2] = fVar9 * fVar10 + fVar8 * 0.0 + fVar7 * fVar12;
  dest[2][3] = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 0.0;
  *(float *)((long)(dest + 3) + 0) = 0.0;
  *(float *)((long)(dest + 3) + 4) = 0.0;
  *(float *)((long)(dest + 3) + 8) = 0.0;
  *(float *)((long)(dest + 3) + 0xc) = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated_y(mat4 m, float angle, mat4 dest) {
  glm_rotated_y(m, angle, dest);
}